

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.cc
# Opt level: O1

void __thiscall avro::json::JsonParser::expectToken(JsonParser *this,Token tk)

{
  string *psVar1;
  Token TVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  double dVar6;
  ostringstream oss;
  string asStack_1b8 [32];
  ostream local_198;
  
  if (this->peeked == false) {
    TVar2 = doAdvance(this);
    this->curToken = TVar2;
  }
  else {
    this->peeked = false;
  }
  if (this->curToken == tk) {
    return;
  }
  if (tk == tkDouble) {
    if (this->curToken == tkString) {
      psVar1 = &this->sv;
      iVar3 = std::__cxx11::string::compare((char *)psVar1);
      if (((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 == 0)) ||
         (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 == 0)) {
        this->curToken = tkDouble;
        iVar3 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar3 == 0) {
          dVar6 = INFINITY;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)psVar1);
          dVar6 = *(double *)(&DAT_001ae7c8 + (ulong)(iVar3 == 0) * 8);
        }
        goto LAB_001a2afc;
      }
    }
    if (this->curToken == tkLong) {
      dVar6 = (double)this->lv;
LAB_001a2afc:
      this->dv = dVar6;
      return;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_198,"Incorrect token in the stream. Expected: ",0x29);
  poVar4 = std::operator<<(&local_198,*(char **)(tokenNames + (ulong)tk * 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", found ",8);
  std::operator<<(poVar4,*(char **)(tokenNames + (ulong)this->curToken * 8));
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error((runtime_error *)(puVar5 + 1),asStack_1b8);
  *puVar5 = 0x1cd6f0;
  puVar5[1] = 0x1cd720;
  __cxa_throw(puVar5,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void JsonParser::expectToken(Token tk)
{
    if (advance() != tk) {
        if (tk == tkDouble) {
            if(cur() == tkString
                && (sv == "Infinity" || sv == "-Infinity" || sv == "NaN")) {
                curToken = tkDouble;
                dv = sv == "Infinity" ?
                    std::numeric_limits<double>::infinity() :
                    sv == "-Infinity" ?
                        -std::numeric_limits<double>::infinity() :
                    std::numeric_limits<double>::quiet_NaN();
                return;
            } else if (cur() == tkLong) {
                dv = double(lv);
                return;
            }
        }
        ostringstream oss;
        oss << "Incorrect token in the stream. Expected: "
            << JsonParser::toString(tk) << ", found "
            << JsonParser::toString(cur());
        throw Exception(oss.str());
    }
}